

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_ifne(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  Value VVar2;
  undefined2 local_3a;
  int16_t branchOffset;
  u1 byte2;
  u1 byte1;
  u1 *code;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  code._4_4_ = VVar2.type;
  if (code._4_4_ == INT) {
    value.printType = VVar2.data._0_4_;
    if (value.printType == BOOLEAN) {
      this_01->pc = this_01->pc + 3;
    }
    else {
      puVar1 = Frame::getCode(this_01,this_01->pc);
      local_3a = CONCAT11(puVar1[1],puVar1[2]);
      this_01->pc = (int)local_3a + this_01->pc;
    }
    return;
  }
  __assert_fail("value.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xbeb,"void ExecutionEngine::i_ifne()");
}

Assistant:

void ExecutionEngine::i_ifne() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();
	
	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::INT);
	
	if (value.data.intValue != 0) {
		u1 *code = topFrame->getCode(topFrame->pc);
		u1 byte1 = code[1];
		u1 byte2 = code[2];
		int16_t branchOffset = (byte1 << 8) | byte2;
		topFrame->pc += branchOffset;
    } else {
		topFrame->pc += 3;
    }
}